

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O3

void __thiscall
glcts::PipelineStatisticsQueryTestFunctionalBase::initQOBO
          (PipelineStatisticsQueryTestFunctionalBase *this)

{
  code *pcVar1;
  code *pcVar2;
  code *pcVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  uchar bo_data [32];
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long lVar6;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  pcVar1 = *(code **)(lVar6 + 0x40);
  pcVar2 = *(code **)(lVar6 + 0x150);
  pcVar3 = *(code **)(lVar6 + 0x800);
  local_48 = 0xffffffff;
  uStack_44 = 0xffffffff;
  uStack_40 = 0xffffffff;
  uStack_3c = 0xffffffff;
  local_58 = 0xffffffff;
  uStack_54 = 0xffffffff;
  uStack_50 = 0xffffffff;
  uStack_4c = 0xffffffff;
  (**(code **)(lVar6 + 0x6c8))(1,&this->m_bo_qo_id);
  dVar5 = (*pcVar3)();
  glu::checkError(dVar5,"glGenBuffers() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                  ,0x89e);
  (*pcVar1)(0x8892,this->m_bo_qo_id);
  dVar5 = (*pcVar3)();
  glu::checkError(dVar5,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                  ,0x8a1);
  (*pcVar2)(0x8892,0x20,&local_58,0x88e4);
  dVar5 = (*pcVar3)();
  glu::checkError(dVar5,"glBufferData() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                  ,0x8a4);
  return;
}

Assistant:

void PipelineStatisticsQueryTestFunctionalBase::initQOBO()
{
	const glw::Functions gl = m_context.getRenderContext().getFunctions();

	/* Set up the buffer object we will use for storage of query object results */
	unsigned char bo_data[PipelineStatisticsQueryUtilities::qo_bo_size];

	memset(bo_data, 0xFF, sizeof(bo_data));

	gl.genBuffers(1, &m_bo_qo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed.");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo_qo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

	gl.bufferData(GL_ARRAY_BUFFER, PipelineStatisticsQueryUtilities::qo_bo_size, bo_data, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed.");
}